

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

int __thiscall
lodepng::ExtractZlib::HuffmanTree::makeFromLengths
          (HuffmanTree *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *bitlen,
          unsigned_long maxbitlen)

{
  long lVar1;
  pointer puVar2;
  unsigned_long uVar3;
  pointer puVar4;
  ulong uVar5;
  unsigned_long bits_1;
  ulong uVar6;
  size_type sVar7;
  ulong uVar8;
  unsigned_long uVar9;
  ulong uVar10;
  long lVar11;
  size_type __n;
  int iVar12;
  allocator_type local_81;
  value_type_conflict2 local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nextcode;
  vector<unsigned_long,_std::allocator<unsigned_long>_> blcount;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tree1d;
  
  lVar11 = (long)(bitlen->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(bitlen->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  __n = lVar11 >> 3;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&tree1d,__n,(allocator_type *)&blcount);
  nextcode.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&blcount,maxbitlen + 1,(value_type_conflict2 *)&nextcode,(allocator_type *)&local_80);
  local_80 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&nextcode,maxbitlen + 1,&local_80,&local_81);
  puVar2 = (bitlen->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (sVar7 = 0; __n != sVar7; sVar7 = sVar7 + 1) {
    blcount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[puVar2[sVar7]] =
         blcount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[puVar2[sVar7]] + 1;
  }
  for (uVar6 = 1; uVar6 <= maxbitlen; uVar6 = uVar6 + 1) {
    nextcode.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6] =
         (blcount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6 - 1] +
         nextcode.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[uVar6 - 1]) * 2;
  }
  puVar2 = (bitlen->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (sVar7 = 0; __n != sVar7; sVar7 = sVar7 + 1) {
    uVar9 = puVar2[sVar7];
    if (uVar9 != 0) {
      uVar3 = nextcode.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9];
      nextcode.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar9] = uVar3 + 1;
      tree1d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[sVar7] = uVar3;
    }
  }
  puVar2 = (this->tree2d).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->tree2d).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->tree2d).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  local_80 = 0x7fff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->tree2d,lVar11 >> 2,&local_80);
  puVar2 = (bitlen->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar12 = 0;
  uVar6 = 0;
  uVar8 = 0;
  uVar9 = 0;
  do {
    if (uVar9 == __n) {
LAB_0011da49:
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&nextcode.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&blcount.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&tree1d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      return iVar12;
    }
    puVar4 = (this->tree2d).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar10 = 0;
    while (uVar5 = puVar2[uVar9], uVar10 < uVar5) {
      if (__n - 2 < uVar6) {
        iVar12 = 0x37;
        goto LAB_0011da49;
      }
      lVar11 = (ulong)((tree1d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar9] >>
                        ((ulong)(~(uint)uVar10 + (int)uVar5) & 0x3f) & 1) != 0) + uVar6 * 2;
      if (puVar4[lVar11] == 0x7fff) {
        uVar10 = uVar10 + 1;
        if (uVar10 == uVar5) {
          puVar4[lVar11] = uVar9;
          uVar6 = 0;
        }
        else {
          lVar1 = uVar8 + __n;
          uVar8 = uVar8 + 1;
          puVar4[lVar11] = lVar1 + 1;
          uVar6 = uVar8;
        }
      }
      else {
        uVar6 = puVar4[lVar11] - __n;
        uVar10 = uVar10 + 1;
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

int makeFromLengths(const std::vector<unsigned long>& bitlen, unsigned long maxbitlen) { //make tree given the lengths
      unsigned long numcodes = (unsigned long)(bitlen.size()), treepos = 0, nodefilled = 0;
      std::vector<unsigned long> tree1d(numcodes), blcount(maxbitlen + 1, 0), nextcode(maxbitlen + 1, 0);
      //count number of instances of each code length
      for(unsigned long bits = 0; bits < numcodes; bits++) blcount[bitlen[bits]]++;
      for(unsigned long bits = 1; bits <= maxbitlen; bits++) {
        nextcode[bits] = (nextcode[bits - 1] + blcount[bits - 1]) << 1;
      }
      //generate all the codes
      for(unsigned long n = 0; n < numcodes; n++) if(bitlen[n] != 0) tree1d[n] = nextcode[bitlen[n]]++;
      tree2d.clear(); tree2d.resize(numcodes * 2, 32767); //32767 here means the tree2d isn't filled there yet
      for(unsigned long n = 0; n < numcodes; n++) //the codes
      for(unsigned long i = 0; i < bitlen[n]; i++) { //the bits for this code
        unsigned long bit = (tree1d[n] >> (bitlen[n] - i - 1)) & 1;
        if(treepos > numcodes - 2) return 55;
        if(tree2d[2 * treepos + bit] == 32767) { //not yet filled in
          if(i + 1 == bitlen[n]) {
            //last bit
            tree2d[2 * treepos + bit] = n;
            treepos = 0;
          } else {
            //addresses are encoded as values > numcodes
            tree2d[2 * treepos + bit] = ++nodefilled + numcodes;
            treepos = nodefilled;
          }
        }
        else treepos = tree2d[2 * treepos + bit] - numcodes; //subtract numcodes from address to get address value
      }
      return 0;
    }